

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O1

int get_next_token(STRING_TOKEN *token,char **delimiters,size_t n_delims)

{
  LOGGER_LOG p_Var1;
  void *__ptr;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((token->token_start != (char *)0x0) && (token->delimiter_start == (char *)0x0)) {
    return 0x4a;
  }
  if (n_delims >> 0x3d == 0) {
    uVar13 = -(ulong)(n_delims >> 0x3d != 0) | n_delims * 8;
    __ptr = malloc(uVar13);
    if (__ptr != (void *)0x0) {
      if (n_delims != 0) {
        uVar12 = 8;
        lVar8 = 0;
        do {
          pcVar11 = *(char **)((long)delimiters + (uVar12 - 8));
          if (pcVar11 == (char *)0x0) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                        ,"get_delimiters_lengths",0x2d,1,"Invalid argument (delimiter %lu is NULL)",
                        -lVar8);
            }
            free(__ptr);
            __ptr = (void *)0x0;
            break;
          }
          if (uVar13 < uVar12) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                        ,"get_delimiters_lengths",0x34,1,"buffer overflow");
            }
            free(__ptr);
            goto LAB_00116199;
          }
          sVar2 = strlen(pcVar11);
          *(size_t *)((long)__ptr + (uVar12 - 8)) = sVar2;
          lVar8 = lVar8 + -1;
          uVar12 = uVar12 + 8;
        } while (-n_delims != lVar8);
      }
      goto LAB_0011619c;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_00116199;
    pcVar11 = "Failed to allocate array for delimiters lengths";
    iVar3 = 0x23;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
LAB_00116199:
      __ptr = (void *)0x0;
      goto LAB_0011619c;
    }
    pcVar11 = "malloc size overflow";
    iVar3 = 0x1e;
  }
  __ptr = (void *)0x0;
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
            ,"get_delimiters_lengths",iVar3,1,pcVar11);
LAB_0011619c:
  if (__ptr == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x53;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                ,"get_next_token",0x52,1,"Failed to get delimiters lengths");
    }
  }
  else {
    pcVar11 = token->source;
    pcVar4 = token->delimiter_start;
    pcVar9 = pcVar11 + token->length;
    pcVar6 = pcVar11;
    if (pcVar4 != (char *)0x0) {
      sVar2 = strlen(token->delimiter);
      pcVar6 = pcVar4 + sVar2;
    }
    pcVar4 = pcVar6;
    if (pcVar6 < pcVar9) {
      pcVar5 = pcVar6 + 2;
      do {
        if (n_delims != 0) {
          sVar10 = 0;
          do {
            if (*pcVar4 == *delimiters[sVar10]) {
              uVar13 = *(ulong *)((long)__ptr + sVar10 * 8);
              uVar12 = 1;
              if ((1 < uVar13) && (pcVar7 = pcVar5, pcVar4 + 1 < pcVar9)) {
                while (pcVar7[-1] == delimiters[sVar10][uVar12]) {
                  uVar12 = uVar12 + 1;
                  if ((uVar13 <= uVar12) || (bVar14 = pcVar9 <= pcVar7, pcVar7 = pcVar7 + 1, bVar14)
                     ) break;
                }
              }
              if (uVar12 == uVar13) {
                token->delimiter_start = pcVar4;
                token->delimiter = delimiters[sVar10];
                if (pcVar4 == pcVar11) {
                  pcVar6 = (char *)0x0;
                }
                token->token_start = pcVar6;
                goto LAB_001162be;
              }
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 != n_delims);
        }
        pcVar4 = pcVar4 + 1;
        pcVar5 = pcVar5 + 1;
      } while (pcVar4 < pcVar9);
    }
    if (pcVar4 == pcVar9) {
      token->token_start = pcVar6;
      token->delimiter_start = (char *)0x0;
      token->delimiter = (char *)0x0;
    }
LAB_001162be:
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int get_next_token(STRING_TOKEN* token, const char** delimiters, size_t n_delims)
{
    int result;

    if (token->token_start != NULL && token->delimiter_start == NULL)
    {
        // The parser reached the end of the input string.
        result = MU_FAILURE;
    }
    else
    {
        size_t* delimiters_lengths;

        if ((delimiters_lengths = get_delimiters_lengths(delimiters, n_delims)) == NULL)
        {
            LogError("Failed to get delimiters lengths");
            result = MU_FAILURE;
        }
        else
        {
            const char* new_token_start;
            const char* current_pos;
            const char* stop_pos = (char*)token->source + token->length;
            size_t j; // iterator for the delimiters.

            if (token->delimiter_start == NULL)
            {
                // Codes_SRS_STRING_TOKENIZER_09_005: [ The source string shall be split in a token starting from the beginning of source up to occurrence of any one of the demiliters, whichever occurs first in the order provided ]
                new_token_start = (char*)token->source;
            }
            else
            {
                // Codes_SRS_STRING_TOKENIZER_09_010: [ The next token shall be selected starting from the position in source right after the previous delimiter up to occurrence of any one of demiliters, whichever occurs first in the order provided ]
                new_token_start = token->delimiter_start + strlen(token->delimiter);
            }

            current_pos = new_token_start;
            result = 0;

            while (current_pos < stop_pos)
            {
                for (j = 0; j < n_delims; j++)
                {
                    if (*current_pos == *delimiters[j])
                    {
                        size_t k;
                        for (k = 1; k < delimiters_lengths[j] && (current_pos + k) < stop_pos; k++)
                        {
                            if (*(current_pos + k) != *(delimiters[j] + k))
                            {
                                break;
                            }
                        }

                        if (k == delimiters_lengths[j])
                        {
                            token->delimiter_start = current_pos;
                            token->delimiter = delimiters[j];

                            if (token->delimiter_start == token->source)
                            {
                                // Delimiter occurs in the beginning of the source string.
                                token->token_start = NULL;
                            }
                            else
                            {
                                token->token_start = new_token_start;
                            }
                            goto SCAN_COMPLETED;
                        }
                    }
                }

                current_pos++;
            }

            // Codes_SRS_STRING_TOKENIZER_09_006: [ If the source string does not have any of the demiliters, the resulting token shall be the entire source string ]
            // Codes_SRS_STRING_TOKENIZER_09_011: [ If the source string, starting right after the position of the last delimiter found, does not have any of the demiliters, the resulting token shall be the entire remaining of the source string ]
            if (current_pos == stop_pos)
            {
                token->token_start = new_token_start;
                token->delimiter_start = NULL;
                // Codes_SRS_STRING_TOKENIZER_09_019: [ If the current token extends to the end of source, the function shall return NULL ]
                token->delimiter = NULL;
            }

SCAN_COMPLETED:
            free(delimiters_lengths);
        }
    }

    return result;
}